

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O1

void __thiscall Assimp::Q3BSPFileParser::getEntities(Q3BSPFileParser *this)

{
  size_type __new_size;
  
  __new_size = (size_type)
               (*(this->m_pModel->m_Lumps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->iSize;
  std::vector<char,_std::allocator<char>_>::resize(&this->m_pModel->m_EntityData,__new_size);
  if (0 < (long)__new_size) {
    memcpy((this->m_pModel->m_EntityData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,
           (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start +
           (*(this->m_pModel->m_Lumps).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
             ._M_impl.super__Vector_impl_data._M_start)->iOffset,__new_size);
    return;
  }
  return;
}

Assistant:

void Q3BSPFileParser::getEntities() {
    const int size = m_pModel->m_Lumps[ kEntities ]->iSize;
    m_pModel->m_EntityData.resize( size );
    if ( size > 0 ) {
        size_t Offset = m_pModel->m_Lumps[ kEntities ]->iOffset;
        memcpy( &m_pModel->m_EntityData[ 0 ], &m_Data[ Offset ], sizeof( char ) * size );
    }
}